

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

bool ImNodes::GetNewConnection
               (void **input_node,char **input_slot_title,void **output_node,
               char **output_slot_title)

{
  long lVar1;
  long lVar2;
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x229,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  if (input_node == (void **)0x0) {
    __assert_fail("input_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x22a,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  if (input_slot_title == (char **)0x0) {
    __assert_fail("input_slot_title != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x22b,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  if (output_node != (void **)0x0) {
    if (output_slot_title != (char **)0x0) {
      lVar1 = *(long *)(gCanvas + 0x98);
      lVar2 = *(long *)(lVar1 + 0x50);
      if (lVar2 != 0) {
        *input_node = *(void **)(lVar1 + 0x40);
        *input_slot_title = *(char **)(lVar1 + 0x48);
        *output_node = *(void **)(lVar1 + 0x50);
        *output_slot_title = *(char **)(lVar1 + 0x58);
        *(undefined8 *)(lVar1 + 0x50) = 0;
        *(undefined8 *)(lVar1 + 0x58) = 0;
        *(undefined8 *)(lVar1 + 0x40) = 0;
        *(undefined8 *)(lVar1 + 0x48) = 0;
      }
      return lVar2 != 0;
    }
    __assert_fail("output_slot_title != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x22d,
                  "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
  }
  __assert_fail("output_node != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x22c,
                "bool ImNodes::GetNewConnection(void **, const char **, void **, const char **)");
}

Assistant:

bool GetNewConnection(void** input_node, const char** input_slot_title, void** output_node, const char** output_slot_title)
{
    assert(gCanvas != nullptr);
    assert(input_node != nullptr);
    assert(input_slot_title != nullptr);
    assert(output_node != nullptr);
    assert(output_slot_title != nullptr);

    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (impl->new_connection.output_node != nullptr)
    {
        *input_node = impl->new_connection.input_node;
        *input_slot_title = impl->new_connection.input_slot;
        *output_node = impl->new_connection.output_node;
        *output_slot_title = impl->new_connection.output_slot;
        memset(&impl->new_connection, 0, sizeof(impl->new_connection));
        return true;
    }

    return false;
}